

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O3

void variance_double_suite::test_linear_decrease(void)

{
  close_to<double> predicate;
  close_to<double> predicate_00;
  close_to<double> predicate_01;
  close_to<double> predicate_02;
  close_to<double> predicate_03;
  close_to<double> predicate_04;
  close_to<double> predicate_05;
  close_to<double> predicate_06;
  close_to<double> predicate_07;
  close_to<double> predicate_08;
  close_to<double> predicate_09;
  close_to<double> predicate_10;
  close_to<double> predicate_11;
  close_to<double> predicate_12;
  close_to<double> predicate_13;
  close_to<double> predicate_14;
  close_to<double> predicate_15;
  close_to<double> predicate_16;
  close_to<double> predicate_17;
  double *in_stack_ffffffffffffffb8;
  double local_40;
  char local_38 [8];
  
  local_38[0] = '\0';
  local_38[1] = '\0';
  local_38[2] = '\0';
  local_38[3] = '\0';
  local_38[4] = '\0';
  local_38[5] = '\0';
  local_38[6] = '$';
  local_38[7] = '@';
  local_40 = 10.0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","10.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x180,"void variance_double_suite::test_linear_decrease()",local_38,&local_40);
  local_38[0] = '\0';
  local_38[1] = '\0';
  local_38[2] = '\0';
  local_38[3] = '\0';
  local_38[4] = '\0';
  local_38[5] = '\0';
  local_38[6] = '\0';
  local_38[7] = '\0';
  local_40 = 0.0;
  predicate.absolute = 2.2250738585072014e-308;
  predicate.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","0.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x181,0x10e678,local_38,&local_40,in_stack_ffffffffffffffb8,predicate);
  local_38[0] = -0x11;
  local_38[1] = -0x12;
  local_38[2] = -0x12;
  local_38[3] = -0x12;
  local_38[4] = -0x12;
  local_38[5] = -0x12;
  local_38[6] = '\"';
  local_38[7] = '@';
  local_40 = 9.46667;
  predicate_00.absolute = 2.2250738585072014e-308;
  predicate_00.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","9.46667","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x183,0x10e678,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_00);
  local_38[0] = -0x76;
  local_38[1] = -0x36;
  local_38[2] = '\x0e';
  local_38[3] = 'S';
  local_38[4] = -0x69;
  local_38[5] = -0x25;
  local_38[6] = -0x41;
  local_38[7] = '?';
  local_40 = 0.124444;
  predicate_01.absolute = 2.2250738585072014e-308;
  predicate_01.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","0.124444","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x184,0x10e678,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_01);
  local_38[0] = -0x26;
  local_38[1] = -0x10;
  local_38[2] = -7;
  local_38[3] = 'c';
  local_38[4] = -0x72;
  local_38[5] = -0x2e;
  local_38[6] = '!';
  local_38[7] = '@';
  local_40 = 8.91124;
  predicate_02.absolute = 2.2250738585072014e-308;
  predicate_02.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","8.91124","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x186,0x10e678,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_02);
  local_38[0] = -0x12;
  local_38[1] = -99;
  local_38[2] = -0x68;
  local_38[3] = -0x11;
  local_38[4] = 'O';
  local_38[5] = -0x80;
  local_38[6] = -0x25;
  local_38[7] = '?';
  local_40 = 0.429707;
  predicate_03.absolute = 2.2250738585072014e-308;
  predicate_03.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","0.429707","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x187,0x10e678,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_03);
  local_38[0] = -0x80;
  local_38[1] = -0x51;
  local_38[2] = -0x36;
  local_38[3] = -2;
  local_38[4] = -9;
  local_38[5] = -0x56;
  local_38[6] = ' ';
  local_38[7] = '@';
  local_40 = 8.33392;
  predicate_04.absolute = 2.2250738585072014e-308;
  predicate_04.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","8.33392","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x189,0x10e678,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_04);
  local_38[0] = -0x72;
  local_38[1] = '}';
  local_38[2] = -0x70;
  local_38[3] = 'v';
  local_38[4] = -0x67;
  local_38[5] = -0x75;
  local_38[6] = -0x13;
  local_38[7] = '?';
  local_40 = 0.923291;
  predicate_05.absolute = 2.2250738585072014e-308;
  predicate_05.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","0.923291","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x18a,0x10e678,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_05);
  local_38[0] = '-';
  local_38[1] = -0x31;
  local_38[2] = -0x7d;
  local_38[3] = 'V';
  local_38[4] = -0x62;
  local_38[5] = -0x10;
  local_38[6] = '\x1e';
  local_38[7] = '@';
  local_40 = 7.73498;
  predicate_06.absolute = 2.2250738585072014e-308;
  predicate_06.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","7.73498","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x18c,0x10e678,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_06);
  local_38[0] = -0x60;
  local_38[1] = '}';
  local_38[2] = '\x1c';
  local_38[3] = 'P';
  local_38[4] = -0x5e;
  local_38[5] = -0x49;
  local_38[6] = -7;
  local_38[7] = '?';
  local_40 = 1.60733;
  predicate_07.absolute = 2.2250738585072014e-308;
  predicate_07.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","1.60733","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x18d,0x10e678,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_07);
  local_38[0] = -0x45;
  local_38[1] = 'n';
  local_38[2] = 's';
  local_38[3] = 'b';
  local_38[4] = -0x7f;
  local_38[5] = 'u';
  local_38[6] = '\x1c';
  local_38[7] = '@';
  local_40 = 7.11475;
  predicate_08.absolute = 2.2250738585072014e-308;
  predicate_08.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","7.11475","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x18f,0x10e678,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_08);
  local_38[0] = '#';
  local_38[1] = -0x4d;
  local_38[2] = 'a';
  local_38[3] = 'a';
  local_38[4] = '2';
  local_38[5] = -0x2c;
  local_38[6] = '\x03';
  local_38[7] = '@';
  local_40 = 2.47861;
  predicate_09.absolute = 2.2250738585072014e-308;
  predicate_09.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","2.47861","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x190,0x10e678,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_09);
  local_38[0] = -0x53;
  local_38[1] = 'X';
  local_38[2] = -0x24;
  local_38[3] = 'Q';
  local_38[4] = '\x04';
  local_38[5] = -0x1b;
  local_38[6] = '\x19';
  local_38[7] = '@';
  local_40 = 6.47365;
  predicate_10.absolute = 2.2250738585072014e-308;
  predicate_10.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","6.47365","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x192,0x10e678,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_10);
  local_38[0] = '\r';
  local_38[1] = -0x3f;
  local_38[2] = 'F';
  local_38[3] = '5';
  local_38[4] = '*';
  local_38[5] = ';';
  local_38[6] = '\f';
  local_38[7] = '@';
  local_40 = 3.52889;
  predicate_11.absolute = 2.2250738585072014e-308;
  predicate_11.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","3.52889","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x193,0x10e678,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_11);
  local_38[0] = '\x1f';
  local_38[1] = -0x20;
  local_38[2] = -0x58;
  local_38[3] = -0x52;
  local_38[4] = -0x5e;
  local_38[5] = '?';
  local_38[6] = '\x17';
  local_38[7] = '@';
  local_40 = 5.81214;
  predicate_12.absolute = 2.2250738585072014e-308;
  predicate_12.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","5.81214","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x195,0x10e678,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_12);
  local_38[0] = '\x06';
  local_38[1] = '\'';
  local_38[2] = -0x78;
  local_38[3] = 't';
  local_38[4] = 'e';
  local_38[5] = -5;
  local_38[6] = '\x12';
  local_38[7] = '@';
  local_40 = 4.7455;
  predicate_13.absolute = 2.2250738585072014e-308;
  predicate_13.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","4.7455","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x196,0x10e678,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_13);
  local_38[0] = -0xe;
  local_38[1] = '\x1d';
  local_38[2] = '?';
  local_38[3] = -0x14;
  local_38[4] = -0x1a;
  local_38[5] = -0x7b;
  local_38[6] = '\x14';
  local_38[7] = '@';
  local_40 = 5.13076;
  predicate_14.absolute = 2.2250738585072014e-308;
  predicate_14.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","5.13076","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x198,0x10e678,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_14);
  local_38[0] = -0x37;
  local_38[1] = -0x36;
  local_38[2] = 'd';
  local_38[3] = '\v';
  local_38[4] = -0x25;
  local_38[5] = 'r';
  local_38[6] = '\x18';
  local_38[7] = '@';
  local_40 = 6.11216;
  predicate_15.absolute = 2.2250738585072014e-308;
  predicate_15.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","6.11216","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x199,0x10e678,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_15);
  local_38[0] = 'R';
  local_38[1] = 'O';
  local_38[2] = '\v';
  local_38[3] = -0x29;
  local_38[4] = 'h';
  local_38[5] = -0x48;
  local_38[6] = '\x11';
  local_38[7] = '@';
  local_40 = 4.43009;
  predicate_16.absolute = 2.2250738585072014e-308;
  predicate_16.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","4.43009","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x19b,0x10e678,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_16);
  local_38[0] = '\x05';
  local_38[1] = '%';
  local_38[2] = -0xc;
  local_38[3] = '\x1a';
  local_38[4] = 'y';
  local_38[5] = 'p';
  local_38[6] = '\x1e';
  local_38[7] = '@';
  local_40 = 7.60984;
  predicate_17.absolute = 2.2250738585072014e-308;
  predicate_17.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","7.60984","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x19c,0x10e678,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_17);
  return;
}

Assistant:

void test_linear_decrease()
{
    const auto tolerance = detail::close_to<double>(1e-5);
    decay::moment_variance<double> filter(one_over_eight, one_over_four);
    filter.push(10.0);
    TRIAL_TEST_EQ(filter.mean(), 10.0);
    TRIAL_TEST_WITH(filter.variance(), 0.0, tolerance);
    filter.push(9.0);
    TRIAL_TEST_WITH(filter.mean(), 9.46667, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 0.124444, tolerance);
    filter.push(8.0);
    TRIAL_TEST_WITH(filter.mean(), 8.91124, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 0.429707, tolerance);
    filter.push(7.0);
    TRIAL_TEST_WITH(filter.mean(), 8.33392, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 0.923291, tolerance);
    filter.push(6.0);
    TRIAL_TEST_WITH(filter.mean(), 7.73498, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 1.60733, tolerance);
    filter.push(5.0);
    TRIAL_TEST_WITH(filter.mean(), 7.11475, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 2.47861, tolerance);
    filter.push(4.0);
    TRIAL_TEST_WITH(filter.mean(), 6.47365, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 3.52889, tolerance);
    filter.push(3.0);
    TRIAL_TEST_WITH(filter.mean(), 5.81214, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 4.7455, tolerance);
    filter.push(2.0);
    TRIAL_TEST_WITH(filter.mean(), 5.13076, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 6.11216, tolerance);
    filter.push(1.0);
    TRIAL_TEST_WITH(filter.mean(), 4.43009, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 7.60984, tolerance);
}